

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O0

int q_dgram_write(BIO *bio,char *src,int bytesToWrite)

{
  bool bVar1;
  int iVar2;
  QByteArray *datagram;
  long lVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qint64 bytesWritten;
  QUdpSocket *udpSocket;
  DtlsState *dtls;
  QByteArray dgram;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  quint16 port;
  QMessageLogger *in_stack_ffffffffffffff80;
  QHostAddress *host;
  undefined4 in_stack_ffffffffffffff90;
  int local_54;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_EDX < 1)) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcTlsBackend();
    anon_unknown.dwarf_19fec1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_19fec1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x17be68);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 (char *)0x17be7e);
      QMessageLogger::warning(local_38,"invalid input parameter(s)");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    local_54 = 0;
  }
  else {
    q_BIO_clear_flags((BIO *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c);
    datagram = (QByteArray *)
               q_BIO_get_ex_data((BIO *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68
                                                ),0);
    local_54 = in_EDX;
    if (((ulong)datagram[5].d.ptr & 1) == 0) {
      host = (QHostAddress *)datagram[5].d.d;
      QByteArray::fromRawData((char *)datagram,(qsizetype)host);
      port = 0xffff;
      iVar2 = QAbstractSocket::state();
      if (iVar2 == 3) {
        lVar3 = QIODevice::write((QByteArray *)host);
      }
      else {
        lVar3 = QUdpSocket::writeDatagram
                          ((QUdpSocket *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),datagram,host,
                           port);
      }
      if (lVar3 < 1) {
        q_BIO_set_flags((BIO *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
      }
      local_54 = (int)lVar3;
      QByteArray::~QByteArray((QByteArray *)0x17bfa7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

int q_dgram_write(BIO *bio, const char *src, int bytesToWrite)
{
    if (!bio || !src || bytesToWrite <= 0) {
        qCWarning(lcTlsBackend, "invalid input parameter(s)");
        return 0;
    }

    q_BIO_clear_retry_flags(bio);

    auto dtls = static_cast<dtlsopenssl::DtlsState *>(q_BIO_get_app_data(bio));
    Q_ASSERT(dtls);
    if (dtls->writeSuppressed) {
        // See the comment in QDtls::startHandshake.
        return bytesToWrite;
    }

    QUdpSocket *udpSocket = dtls->udpSocket;
    Q_ASSERT(udpSocket);

    const QByteArray dgram(QByteArray::fromRawData(src, bytesToWrite));
    qint64 bytesWritten = -1;
    if (udpSocket->state() == QAbstractSocket::ConnectedState) {
        bytesWritten = udpSocket->write(dgram);
    } else {
        bytesWritten = udpSocket->writeDatagram(dgram, dtls->remoteAddress,
                                                dtls->remotePort);
    }

    if (bytesWritten <= 0)
        q_BIO_set_retry_write(bio);

    Q_ASSERT(bytesWritten <= std::numeric_limits<int>::max());
    return int(bytesWritten);
}